

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::TimingCheckEventArgSyntax::setChild
          (TimingCheckEventArgSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00483f00 + *(int *)(&DAT_00483f00 + index * 4)))();
  return;
}

Assistant:

void TimingCheckEventArgSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: edge = child.token(); return;
        case 1: controlSpecifier = child.node() ? &child.node()->as<EdgeControlSpecifierSyntax>() : nullptr; return;
        case 2: terminal = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: condition = child.node() ? &child.node()->as<TimingCheckEventConditionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}